

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

void CVmObjFile::check_safety_for_open(CVmNetFile *nf,int access)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  
  if (nf->sfid != 0) {
    if (access - 1U < 4) {
      return;
    }
    if (access == 0x1001) {
      return;
    }
    if (access == 0x1004) {
      return;
    }
  }
  if (nf->is_temp != 0) {
    if (access - 1U < 4) {
      return;
    }
    if ((access - 0x1000U < 5) && ((0x13U >> (access - 0x1000U & 0x1f) & 1) != 0)) {
      return;
    }
  }
  if (nf->srvfname != (char *)0x0) {
    return;
  }
  uVar2 = nf->filespec;
  if ((uVar2 != 0) &&
     (iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[uVar2 >> 0xc] + (uVar2 & 0xfff),
                         CVmObjFileName::metaclass_reg_), iVar3 != 0)) {
    if (G_obj_table_X.pages_[nf->filespec >> 0xc] != (CVmObjPageEntry *)0x0) {
      cVar1 = *(char *)(*(long *)((long)&G_obj_table_X.pages_[nf->filespec >> 0xc]
                                         [nf->filespec & 0xfff].ptr_ + 8) + 5);
      if (cVar1 == '\x02') {
        if (access == 2) {
          return;
        }
      }
      else if ((cVar1 == '\x01') && (access == 1)) {
        return;
      }
    }
  }
  check_safety_for_open(nf->lclfname,access);
  return;
}

Assistant:

void CVmObjFile::check_safety_for_open(VMG_ CVmNetFile *nf, int access)
{
    /* 
     *   Special files are inherently sandboxed, since the system determines
     *   their paths.  These are always allowed for ordinary read/write.
     */
    if (nf->sfid != 0
        && (access == VMOBJFILE_ACCESS_READ
            || access == VMOBJFILE_ACCESS_WRITE
            || access == VMOBJFILE_ACCESS_RW_KEEP
            || access == VMOBJFILE_ACCESS_RW_TRUNC
            || access == VMOBJFILE_ACCESS_GETINFO
            || access == VMOBJFILE_ACCESS_READDIR))
        return;

    /*
     *   Temporary file paths can only be obtained from the VM.  Ordinary
     *   read/write operations are allowed, as is delete. 
     */
    if (nf->is_temp
        && (access == VMOBJFILE_ACCESS_READ
            || access == VMOBJFILE_ACCESS_WRITE
            || access == VMOBJFILE_ACCESS_RW_KEEP
            || access == VMOBJFILE_ACCESS_RW_TRUNC
            || access == VMOBJFILE_ACCESS_DELETE
            || access == VMOBJFILE_ACCESS_GETINFO
            || access == VMOBJFILE_ACCESS_READDIR))
        return;

    /*
     *   Network files are subject to separate permission rules enforced by
     *   the storage server.  Local file safety settings don't apply. 
     */
    if (nf->is_net_file())
        return;
    
    /*   
     *   If the file was specifically selected by the user via a file dialog,
     *   allow access of the type proposed by the dialog, even if it's
     *   outside the sandbox.  The user has implicitly granted us permission
     *   on this individual file by manually selecting it via a UI
     *   interaction.
     */
    CVmObjFileName *ofn;
    if ((ofn = vm_objid_cast(CVmObjFileName, nf->filespec)) != 0
        && ofn->get_from_ui() != 0)
    {
        /* grant permission based on the dialog mode */
        switch (ofn->get_from_ui())
        {
        case OS_AFP_OPEN:
            /* allow reading for a file selected with an Open dialog */
            if (access == VMOBJFILE_ACCESS_READ)
                return;
            break;

        case OS_AFP_SAVE:
            /* allow writing for a file selected with a Save dialog */
            if (access == VMOBJFILE_ACCESS_WRITE)
                return;
            break;
        }

        /* 
         *   For anything we didn't override above based on the dialog mode,
         *   don't give up - the file safety permissions might still allow
         *   it.  All we've determined at this point is that the dialog
         *   selection doesn't grant extraordinary permission for the
         *   attempted access mode.
         */
    }

    /*
     *   The file wasn't specified by a type that confers any special
     *   privileges, so determine if it's accessible according to the local
     *   file name's handling under the file safety and sandbox rules.
     */
    return check_safety_for_open(vmg_ nf->lclfname, access);
}